

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O1

ssize_t __thiscall
ddd::DictionaryMLT<true,_true>::write
          (DictionaryMLT<true,_true> *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  ssize_t sVar2;
  void *__buf_00;
  undefined4 in_register_00000034;
  char *pcVar3;
  long lVar4;
  long lVar5;
  long local_30;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  DaTrie<true,_true,_true>::write(*(DaTrie<true,_true,_true> **)(this + 8),__fd,__buf,__n);
  lVar5 = *(long *)(this + 0x18);
  lVar1 = *(long *)(this + 0x10);
  lVar4 = lVar5 - lVar1 >> 3;
  local_30 = lVar4;
  std::ostream::write(pcVar3,(long)&local_30);
  if (lVar5 != lVar1) {
    lVar5 = 0;
    do {
      if (*(long *)(*(long *)(this + 0x10) + lVar5 * 8) == 0) {
        local_30 = (ulong)local_30._1_7_ << 8;
        std::ostream::write(pcVar3,(long)&local_30);
      }
      else {
        local_30 = CONCAT71(local_30._1_7_,1);
        std::ostream::write(pcVar3,(long)&local_30);
        DaTrie<true,_true,_false>::write
                  (*(DaTrie<true,_true,_false> **)(*(long *)(this + 0x10) + lVar5 * 8),__fd,__buf_00
                   ,__n);
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  local_30 = CONCAT44(local_30._4_4_,*(undefined4 *)(this + 0x28));
  std::ostream::write(pcVar3,(long)&local_30);
  local_30 = *(long *)(this + 0x30);
  sVar2 = std::ostream::write(pcVar3,(long)&local_30);
  return sVar2;
}

Assistant:

void write(std::ostream& os) const {
    prefix_subtrie_->write(os);
    auto num_suffixes = suffix_subtries_.size();
    utils::write_value(num_suffixes, os);
    for (size_t i = 0; i < num_suffixes; ++i) {
      if (suffix_subtries_[i]) {
        utils::write_value(true, os);
        suffix_subtries_[i]->write(os);
      } else {
        utils::write_value(false, os);
      }
    }
    utils::write_value(suffix_head_, os);
    utils::write_value(num_keys_, os);
  }